

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauss_pyramid.h
# Opt level: O0

void gimage::createGaussPyramid<float,float>
               (vector<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
                *p,Image<float,_gimage::PixelTraits<float>_> *image)

{
  Image<float,_gimage::PixelTraits<float>_> *this;
  Image<float,_gimage::PixelTraits<float>_> *a;
  long *plVar1;
  reference pvVar2;
  Image<float,_gimage::PixelTraits<float>_> *in_RSI;
  vector<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
  *in_RDI;
  __type _Var3;
  __type _Var4;
  double dVar5;
  int i;
  int n;
  Image<float,_gimage::PixelTraits<float>_> *in_stack_000000d8;
  Image<float,_gimage::PixelTraits<float>_> *in_stack_000000e0;
  int local_2c;
  int local_14;
  
  this = (Image<float,_gimage::PixelTraits<float>_> *)
         Image<float,_gimage::PixelTraits<float>_>::getWidth(in_RSI);
  a = (Image<float,_gimage::PixelTraits<float>_> *)
      Image<float,_gimage::PixelTraits<float>_>::getHeight(in_RSI);
  plVar1 = std::min<long>((long *)&stack0xffffffffffffffe0,(long *)&stack0xffffffffffffffd8);
  if ((int)*plVar1 < 2) {
    local_14 = 0;
  }
  else {
    _Var3 = std::log<int>(0);
    _Var4 = std::log<int>(0);
    dVar5 = floor(_Var3 / _Var4);
    local_14 = (int)dVar5;
  }
  std::
  vector<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
  ::resize((vector<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
            *)this,(size_type)a);
  if (local_14 != 0) {
    pvVar2 = std::
             vector<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
             ::operator[](in_RDI,0);
    if (pvVar2 != in_RSI) {
      std::
      vector<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
      ::operator[](in_RDI,0);
      Image<float,_gimage::PixelTraits<float>_>::setImage(this,a);
    }
    for (local_2c = 1; local_2c < local_14; local_2c = local_2c + 1) {
      std::
      vector<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
      ::operator[](in_RDI,(long)local_2c);
      std::
      vector<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
      ::operator[](in_RDI,(long)(local_2c + -1));
      reduceGauss<float,float>(in_stack_000000e0,in_stack_000000d8);
    }
  }
  return;
}

Assistant:

void createGaussPyramid(std::vector<Image<T> > &p, const Image<S> &image)
{
  // determine number of levels

  int n=std::min(image.getWidth(), image.getHeight());

  if (n >= 2)
  {
    n=static_cast<int>(std::floor(std::log(n)/std::log(2)));
  }
  else
  {
    n=0;
  }

  p.resize(n);

  if (n == 0) return; // input image is too small

  // populate highest level with given image if not already done

  if (&(p[0]) != &image)
  {
    p[0].setImage(image);
  }

  // smooth and downsample image for all other levels

  for (int i=1; i<n; i++)
  {
    reduceGauss(p[i], p[i-1]);
  }
}